

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_instid(lyd_node *data,char *path,int req_inst,lyd_node **ret)

{
  byte bVar1;
  lys_node *plVar2;
  bool bVar3;
  lyd_node *plVar4;
  lyd_node *plVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  lys_module *plVar10;
  ushort **ppuVar11;
  lyd_node **pplVar12;
  lyd_node *plVar13;
  LY_VLOG_ELEM elem_type;
  int iVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  char *pcVar17;
  LY_ECODE ecode;
  lyd_node *plVar18;
  ulong uVar19;
  int iVar20;
  LYS_NODE LVar21;
  ly_ctx *plVar22;
  void *pvVar23;
  long lVar24;
  size_t sVar25;
  char *pcVar26;
  int iVar27;
  uint uVar28;
  char *pcVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  ushort *puVar33;
  char cVar34;
  char *in_stack_fffffffffffffee0;
  char *local_f8;
  char *model;
  lys_node *local_e8;
  char *local_e0;
  undefined1 auStack_d8 [8];
  unres_data node_match;
  char *name;
  int mod_len;
  lyd_node *local_98;
  ushort **local_90;
  lys_module *local_88;
  char *local_80;
  uint local_74;
  char *local_70;
  ulong local_68;
  ly_ctx *local_60;
  ly_ctx *local_58;
  char *local_50;
  char *local_48;
  lyd_node *local_40;
  int local_38;
  uint32_t local_34;
  
  local_58 = data->schema->module->ctx;
  node_match.type = (UNRES_ITEM *)0x0;
  node_match.count = 0;
  node_match.store_diff = 0;
  auStack_d8 = (undefined1  [8])0x0;
  node_match.node = (lyd_node **)0x0;
  node_match.diff = (lyd_difflist *)0x0;
  *ret = (lyd_node *)0x0;
  plVar13 = data;
  do {
    plVar18 = plVar13;
    plVar13 = plVar18->parent;
  } while (plVar18->parent != (lyd_node *)0x0);
  plVar13 = plVar18->prev;
  plVar5 = plVar18;
  while (plVar4 = plVar18, plVar13 != (lyd_node *)0x0) {
    plVar18 = plVar4->prev;
    plVar13 = plVar18->next;
    plVar5 = plVar4;
  }
  uVar32 = 0;
  local_e0 = (char *)0x0;
  local_88 = (lys_module *)0x0;
  uVar31 = 0;
  model._4_4_ = req_inst;
  local_98 = data;
  local_80 = path;
  uVar7 = 0;
  uVar28 = 0;
  do {
    local_68 = uVar31;
    if (path[uVar31 & 0xffffffff] != '/') {
      uVar7 = 0;
      if (path[uVar31 & 0xffffffff] == '\0') {
LAB_0011bc7f:
        if (uVar32 == 1) {
LAB_0011bd8c:
          *ret = *(lyd_node **)auStack_d8;
          free((void *)auStack_d8);
          return 0;
        }
        if (uVar32 == 0) {
          if (-1 < model._4_4_) {
            ly_vlog(local_58,LYE_NOREQINS,LY_VLOG_LYD,local_98,path);
            return 1;
          }
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                 "There is no instance of \"%s\", but it is not required.",path);
          return 0;
        }
        ly_vlog(local_58,LYE_TOOMANY,LY_VLOG_LYD,local_98,path,"data tree");
      }
      else {
LAB_0011bd20:
        uVar7 = (int)local_68 - uVar7;
        ly_vlog(local_58,LYE_INCHAR,LY_VLOG_LYD,local_98,(ulong)(uint)(int)path[uVar7],path + uVar7)
        ;
      }
LAB_0011bd48:
      free((void *)auStack_d8);
      return -1;
    }
    local_48 = (char *)CONCAT44(local_48._4_4_,uVar7);
    pcVar17 = path + (uVar31 & 0xffffffff) + 1;
    uVar6 = parse_identifier(pcVar17);
    plVar22 = local_58;
    uVar7 = uVar6;
    if ((int)uVar6 < 1) goto LAB_0011bd20;
    if (pcVar17[uVar6] == ':') {
      pcVar29 = pcVar17 + (ulong)uVar6 + 1;
      uVar7 = parse_identifier(pcVar29);
      path = local_80;
      if ((int)uVar7 < 1) goto LAB_0011bd20;
      local_40 = (lyd_node *)CONCAT44(local_40._4_4_,uVar7);
      local_38 = CONCAT31(local_38._1_3_,pcVar29[uVar7] == '[');
      local_68 = (ulong)((int)local_68 + 2 + uVar6 + uVar7);
      local_e0 = pcVar17;
      pcVar17 = pcVar29;
LAB_0011b22a:
      pcVar29 = strndup(local_e0,(long)(int)uVar6);
      plVar22 = local_58;
      if (pcVar29 == (char *)0x0) {
        ly_log(local_58,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_instid");
        goto LAB_0011bd48;
      }
      model._0_4_ = uVar6;
      local_50 = pcVar17;
      plVar10 = ly_ctx_get_module(local_58,pcVar29,(char *)0x0,1);
      if (plVar22->data_clb != (ly_module_data_clb)0x0) {
        if (plVar10 == (lys_module *)0x0) {
          pvVar23 = local_58->data_clb_data;
          pcVar17 = (char *)0x0;
          iVar8 = 0;
          pcVar26 = pcVar29;
        }
        else {
          if ((plVar10->field_0x40 & 0x80) != 0) goto LAB_0011b2c5;
          pcVar17 = plVar10->ns;
          pvVar23 = local_58->data_clb_data;
          iVar8 = 1;
          pcVar26 = plVar10->name;
        }
        plVar10 = (*plVar22->data_clb)(local_58,pcVar26,pcVar17,iVar8,pvVar23);
      }
LAB_0011b2c5:
      free(pcVar29);
      path = local_80;
      if ((plVar10 == (lys_module *)0x0) ||
         (pcVar17 = local_50, local_88 = plVar10, (*(ushort *)&plVar10->field_0x40 & 0xc0) != 0x80))
      goto LAB_0011bc7f;
    }
    else {
      local_38 = CONCAT31(local_38._1_3_,pcVar17[uVar6] == '[');
      local_68 = (ulong)((int)local_68 + uVar6 + 1);
      if (local_e0 != (char *)0x0) {
        local_40 = (lyd_node *)CONCAT44(local_40._4_4_,uVar6);
        uVar6 = (uint)model;
        goto LAB_0011b22a;
      }
      if (local_88 == (lys_module *)0x0) {
        ly_vlog(local_58,LYE_INELEM_LEN,LY_VLOG_LYD,local_98,(ulong)uVar6,pcVar17);
        pcVar17 = "Instance-identifier is missing prefix in the first node.";
        ecode = LYE_SPEC;
        elem_type = LY_VLOG_PREV;
        plVar13 = (lyd_node *)0x0;
LAB_0011bc49:
        ly_vlog(plVar22,ecode,elem_type,plVar13,pcVar17);
        goto LAB_0011bd48;
      }
      local_40 = (lyd_node *)CONCAT44(local_40._4_4_,uVar6);
      local_e0 = (char *)0x0;
    }
    uVar7 = (uint)local_48;
    if (uVar28 == 0) {
      node_match.type = (UNRES_ITEM *)CONCAT44(node_match.type._4_4_,1);
      auStack_d8 = (undefined1  [8])malloc(8);
      if (auStack_d8 == (undefined1  [8])0x0) {
        ly_log(local_88->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_data");
        goto LAB_0011bd8c;
      }
      *(lyd_node **)auStack_d8 = (lyd_node *)0x0;
      uVar28 = 1;
      uVar32 = 1;
      uVar7 = 1;
    }
    uVar31 = (ulong)local_40 & 0xffffffff;
    uVar6 = 0;
    local_50 = pcVar17;
    while (path = local_80, uVar6 < uVar28) {
      plVar13 = *(lyd_node **)((long)auStack_d8 + (ulong)uVar6 * 8);
      if (plVar13 == (lyd_node *)0x0) {
        bVar3 = false;
        plVar13 = plVar5;
        goto LAB_0011b379;
      }
      if ((plVar13->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        pplVar12 = &plVar13->child;
        bVar3 = false;
        while( true ) {
          plVar13 = *pplVar12;
LAB_0011b379:
          if (plVar13 == (lyd_node *)0x0) break;
          plVar10 = lyd_node_module(plVar13);
          if (plVar10 == local_88) {
            pcVar17 = plVar13->schema->name;
            iVar8 = strncmp(pcVar17,local_50,uVar31);
            if ((iVar8 == 0) && (pcVar17[uVar31] == '\0')) {
              if (bVar3) {
                uVar19 = (ulong)node_match.type & 0xffffffff;
                uVar32 = (uint)node_match.type + 1;
                node_match.type = (UNRES_ITEM *)CONCAT44(node_match.type._4_4_,uVar32);
                auStack_d8 = (undefined1  [8])ly_realloc((void *)auStack_d8,(ulong)uVar32 * 8);
                if (auStack_d8 == (undefined1  [8])0x0) {
                  ly_log(local_88->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "resolve_data");
                  path = local_80;
                  goto LAB_0011bc7f;
                }
                *(lyd_node **)((long)auStack_d8 + uVar19 * 8) = plVar13;
                uVar6 = uVar6 + 1;
              }
              else {
                *(lyd_node **)((long)auStack_d8 + (ulong)uVar6 * 8) = plVar13;
              }
              bVar3 = true;
            }
          }
          pplVar12 = &plVar13->next;
        }
        if (bVar3) goto LAB_0011b401;
        unres_data_del((unres_data *)auStack_d8,uVar6);
      }
      else {
LAB_0011b401:
        uVar6 = uVar6 + 1;
      }
      uVar32 = (uint)node_match.type;
      uVar7 = (uint)node_match.type;
      uVar28 = (uint)node_match.type;
    }
    if (uVar28 == 0) goto LAB_0011bc7f;
    if ((char)local_38 == '\0') {
      uVar15 = 0;
      while (uVar31 = local_68, uVar15 < uVar28) {
        uVar16 = uVar15;
        if ((*(lyd_node **)((long)auStack_d8 + (long)(int)uVar15 * 8))->schema->nodetype == LYS_LIST
           ) {
          uVar16 = uVar15 - 1;
          unres_data_del((unres_data *)auStack_d8,uVar15);
          uVar7 = (uint)node_match.type;
          uVar32 = (uint)node_match.type;
        }
        uVar28 = uVar7;
        uVar15 = uVar16 + 1;
      }
      if (uVar28 == 0) {
        uVar28 = 0;
        ly_vlog(local_58,LYE_SPEC,LY_VLOG_LYD,local_98,"Instance identifier is missing list keys.");
      }
    }
    else {
      pcVar17 = local_80 + (local_68 & 0xffffffff);
      uVar15 = 0;
      uVar31 = 0;
      name._4_4_ = 1;
      local_70 = pcVar17;
LAB_0011b476:
      if ((int)uVar15 < (int)uVar32) {
        plVar13 = *(lyd_node **)((long)auStack_d8 + (long)(int)uVar15 * 8);
        if (plVar13 == (lyd_node *)0x0) {
          __assert_fail("pred && node && *node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x1176,
                        "int resolve_instid_predicate(const struct lys_module *, const char *, struct lyd_node **, int)"
                       );
        }
        local_60 = local_88->ctx;
        local_50 = (char *)0x0;
        local_e8 = (lys_node *)0x0;
        uVar31 = 0;
        local_34 = uVar15;
LAB_0011b4ba:
        local_f8 = (char *)0x0;
        name._0_4_ = 0;
        node_match.diff_size = 0;
        node_match.diff_idx = 0;
        local_74 = 0;
        iVar8 = (int)uVar31;
        if (pcVar17[uVar31] == '[') {
          local_48 = (char *)CONCAT44(local_48._4_4_,iVar8);
          ppuVar11 = __ctype_b_loc();
          lVar30 = 0;
          do {
            lVar24 = lVar30;
            cVar34 = pcVar17[lVar24 + uVar31 + 1];
            uVar19 = (ulong)cVar34;
            lVar30 = lVar24 + 1;
          } while (((*ppuVar11)[uVar19] >> 0xd & 1) != 0);
          pcVar29 = pcVar17 + lVar30 + uVar31;
          iVar8 = (int)lVar30;
          if (((*ppuVar11)[uVar19] >> 0xb & 1) == 0) {
            if (cVar34 == '.') {
              local_74 = 1;
              lVar30 = lVar30 + uVar31 + 1;
              uVar31 = lVar24 + 2;
              node_match._32_8_ = pcVar29;
LAB_0011b5a3:
              pcVar26 = pcVar17 + lVar30;
              puVar33 = *ppuVar11;
              iVar20 = -(uint)pcVar26;
              lVar30 = 0;
              iVar27 = (int)uVar31;
              uVar31 = uVar31 & 0xffffffff;
              pcVar29 = pcVar26;
              iVar14 = iVar20;
              while( true ) {
                iVar8 = (int)uVar31;
                if ((*(byte *)((long)puVar33 + (long)*pcVar29 * 2 + 1) & 0x20) == 0) break;
                uVar31 = (ulong)(iVar8 + 1);
                pcVar29 = pcVar29 + 1;
                lVar30 = lVar30 + 1;
                iVar14 = iVar14 + -1;
              }
              pcVar17 = local_70;
              uVar15 = local_34;
              local_40 = plVar13;
              if (*pcVar29 == '=') {
                do {
                  lVar24 = lVar30;
                  cVar34 = pcVar26[lVar24 + 1];
                  lVar30 = lVar24 + 1;
                  iVar14 = iVar14 + -1;
                } while ((*(byte *)((long)puVar33 + (long)cVar34 * 2 + 1) & 0x20) != 0);
                iVar8 = (int)lVar30;
                if ((cVar34 == '\'') || (cVar34 == '\"')) {
                  _mod_len = pcVar26 + lVar24 + 2;
                  local_90 = ppuVar11;
                  pcVar29 = strchr(_mod_len,(int)cVar34);
                  pcVar17 = local_70;
                  uVar15 = local_34;
                  ppuVar11 = local_90;
                  if (pcVar29 != (char *)0x0) {
                    iVar9 = (int)pcVar29;
                    local_38 = (~(uint)pcVar26 + iVar9) - iVar8;
                    iVar8 = iVar27 + iVar20 + iVar9 + 1;
                    pcVar26 = pcVar26 + lVar30 + (iVar14 + iVar9) + 1;
                    goto LAB_0011b6a1;
                  }
                  uVar28 = ~(iVar27 + iVar8);
                  cVar34 = true;
                  pcVar29 = (char *)0x0;
                  local_38 = 0;
                  plVar13 = local_40;
                  iVar8 = (uint)local_48;
                  goto LAB_0011b733;
                }
                iVar8 = iVar27 + iVar8;
              }
LAB_0011b730:
              local_38 = 0;
              uVar28 = -iVar8;
              pcVar29 = (char *)0x0;
              cVar34 = true;
              iVar8 = (uint)local_48;
            }
            else {
              uVar28 = parse_node_identifier
                                 (pcVar29,&local_f8,(int *)&name,(char **)&node_match.diff_size,
                                  (int *)&local_74,(int *)0x0,0);
              if (0 < (int)uVar28) {
                lVar30 = (ulong)uVar28 + lVar30 + uVar31;
                uVar31 = (ulong)(uVar28 + iVar8);
                goto LAB_0011b5a3;
              }
              uVar28 = uVar28 - iVar8;
              cVar34 = true;
              pcVar29 = (char *)0x0;
              local_38 = 0;
              pcVar17 = local_70;
              iVar8 = (uint)local_48;
            }
          }
          else {
            node_match._32_8_ = pcVar29;
            if (cVar34 == '0') goto LAB_0011b730;
            puVar33 = *ppuVar11;
            local_74 = 0;
            pcVar26 = pcVar29;
            while ((*(byte *)((long)puVar33 + (long)(char)uVar19 * 2 + 1) & 8) != 0) {
              uVar19 = (ulong)(byte)pcVar26[1];
              pcVar26 = pcVar26 + 1;
              local_74 = local_74 + 1;
            }
            iVar8 = iVar8 + local_74;
            _mod_len = (char *)0x0;
            local_38 = 0;
            local_40 = plVar13;
LAB_0011b6a1:
            lVar30 = 0;
            while ((*(byte *)((long)puVar33 + (long)pcVar26[lVar30] * 2 + 1) & 0x20) != 0) {
              lVar30 = lVar30 + 1;
            }
            if (pcVar26[lVar30] == ']') {
              uVar28 = iVar8 + (int)lVar30 + 1;
              cVar34 = pcVar26[lVar30 + 1] != '[';
            }
            else {
              uVar28 = -(iVar8 + (int)lVar30);
              cVar34 = true;
            }
            pcVar29 = _mod_len;
            plVar13 = local_40;
            iVar8 = (uint)local_48;
          }
LAB_0011b733:
          if ((int)uVar28 < 1) goto LAB_0011b9c3;
          uVar31 = (ulong)(uVar28 + iVar8);
          if (plVar13 == (lyd_node *)0x0) {
            plVar13 = (lyd_node *)0x0;
            goto LAB_0011b857;
          }
          local_90 = (ushort **)CONCAT71(local_90._1_7_,cVar34);
          local_48 = (char *)node_match._32_8_;
          if ((long)*(char *)node_match._32_8_ == 0x2e) {
            LVar21 = plVar13->schema->nodetype;
            if (LVar21 == LYS_LEAFLIST) {
              iVar8 = valequal(plVar13->schema,pcVar29,local_38,(char *)plVar13->ht);
              if (iVar8 != 0) goto LAB_0011b851;
              plVar13 = (lyd_node *)0x0;
              goto LAB_0011baac;
            }
            strnodetype(LVar21);
            pcVar29 = "Instance identifier expects leaf-list, but have %s \"%s\".";
            goto LAB_0011ba9a;
          }
          if ((*(byte *)((long)*ppuVar11 + (long)*(char *)node_match._32_8_ * 2 + 1) & 8) == 0) {
            plVar2 = plVar13->schema;
            LVar21 = plVar2->nodetype;
            _mod_len = pcVar29;
            if (LVar21 == LYS_LIST) {
              bVar1 = plVar2->padding[2];
              if (local_50 == (char *)0x0) {
                local_50 = (char *)malloc((ulong)((uint)bVar1 * 8));
                if (local_50 == (char *)0x0) {
                  ly_log(local_60,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "resolve_instid_predicate");
                  iVar8 = -1;
                  goto LAB_0011bc2a;
                }
                for (uVar19 = 0; bVar1 != uVar19; uVar19 = uVar19 + 1) {
                  *(undefined8 *)(local_50 + uVar19 * 8) =
                       *(undefined8 *)(*(long *)&plVar2[1].flags + uVar19 * 8);
                }
              }
              uVar28 = local_74;
              sVar25 = (size_t)(int)local_74;
              uVar19 = 0;
              local_e8 = plVar2;
              local_40 = plVar13;
              do {
                if (bVar1 == uVar19) {
                  in_stack_fffffffffffffee0 = local_e8->name;
                  ly_vlog(local_60,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                          "Instance identifier expects list with the key \"%.*s\", but list \"%s\" does not define it."
                          ,(ulong)uVar28,local_48,in_stack_fffffffffffffee0);
                  pcVar17 = local_70;
                  uVar15 = local_34;
                  goto LAB_0011b9b5;
                }
                if (*(undefined8 **)(local_50 + uVar19 * 8) != (undefined8 *)0x0) {
                  pcVar17 = (char *)**(undefined8 **)(local_50 + uVar19 * 8);
                  iVar14 = strncmp(pcVar17,local_48,sVar25);
                  iVar8 = (int)name;
                  if ((iVar14 == 0) && (pcVar17[sVar25] == '\0')) goto LAB_0011b8cc;
                }
                uVar19 = uVar19 + 1;
              } while( true );
            }
          }
          else {
            if (pcVar29 != (char *)0x0) {
              __assert_fail("!value",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                            ,0x1195,
                            "int resolve_instid_predicate(const struct lys_module *, const char *, struct lyd_node **, int)"
                           );
            }
            plVar2 = plVar13->schema;
            LVar21 = plVar2->nodetype;
            if (LVar21 == LYS_LIST) {
              lVar30._0_2_ = plVar2[1].flags;
              lVar30._2_1_ = plVar2[1].ext_size;
              lVar30._3_1_ = plVar2[1].iffeature_size;
              lVar30._4_1_ = plVar2[1].padding[0];
              lVar30._5_1_ = plVar2[1].padding[1];
              lVar30._6_1_ = plVar2[1].padding[2];
              lVar30._7_1_ = plVar2[1].padding[3];
              if (lVar30 == 0) {
                iVar8 = atoi((char *)node_match._32_8_);
                uVar15 = local_34;
                if (iVar8 == name._4_4_) goto LAB_0011b851;
                plVar13 = (lyd_node *)0x0;
                goto LAB_0011baac;
              }
              pcVar29 = "Instance identifier expects list without keys, but have list \"%s\".";
              goto LAB_0011ba9a;
            }
          }
          strnodetype(LVar21);
          pcVar29 = "Instance identifier expects list, but have %s \"%s\".";
          goto LAB_0011ba9a;
        }
        uVar28 = 0;
LAB_0011b9c3:
        uVar31 = (ulong)(uVar28 - iVar8);
        goto LAB_0011bab5;
      }
      uVar31 = (ulong)(uint)((int)uVar31 + (int)local_68);
      path = local_80;
      uVar7 = uVar32;
      uVar28 = uVar32;
    }
  } while( true );
LAB_0011b8cc:
  plVar2 = *(lys_node **)(local_50 + uVar19 * 8);
  plVar10 = plVar2->module;
  if (local_f8 == (char *)0x0) {
    if (plVar10 == local_88) goto LAB_0011b91c;
    pcVar17 = plVar2->name;
    pcVar29 = local_88->name;
    in_stack_fffffffffffffee0 = plVar10->name;
    pcVar26 = "Instance identifier expects key \"%s\" from module \"%s\", not \"%s\".";
  }
  else {
    pcVar17 = plVar10->name;
    sVar25 = (size_t)(int)name;
    local_48 = local_f8;
    iVar14 = strncmp(pcVar17,local_f8,sVar25);
    if ((iVar14 == 0) && (pcVar17[sVar25] == '\0')) {
LAB_0011b91c:
      uVar15 = local_34;
      pcVar17 = local_70;
      pplVar12 = &local_40->child;
      while( true ) {
        plVar13 = *pplVar12;
        if (plVar13 == (lyd_node *)0x0) {
          ly_log(local_60,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                );
          goto LAB_0011b9b5;
        }
        if (plVar13->schema == plVar2) break;
        pplVar12 = &plVar13->next;
      }
      iVar8 = valequal(plVar13->schema,_mod_len,local_38,(char *)plVar13->ht);
      if (iVar8 == 0) {
        plVar13 = (lyd_node *)0x0;
      }
      else {
        pcVar29 = local_50 + uVar19 * 8;
        pcVar29[0] = '\0';
        pcVar29[1] = '\0';
        pcVar29[2] = '\0';
        pcVar29[3] = '\0';
        pcVar29[4] = '\0';
        pcVar29[5] = '\0';
        pcVar29[6] = '\0';
        pcVar29[7] = '\0';
        plVar13 = local_40;
      }
LAB_0011b851:
      cVar34 = (char)local_90;
LAB_0011b857:
      if (cVar34 != '\0') goto LAB_0011b9cb;
      goto LAB_0011b4ba;
    }
    pcVar17 = plVar2->name;
    in_stack_fffffffffffffee0 =
         (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),iVar8);
    pcVar26 = "Instance identifier expects key \"%s\" from module \"%.*s\", not \"%s\".";
    pcVar29 = local_48;
  }
  ly_vlog(local_60,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar26,pcVar17,pcVar29,
          in_stack_fffffffffffffee0);
  pcVar17 = local_70;
  uVar15 = local_34;
LAB_0011b9b5:
  uVar31 = 0xffffffff;
  plVar13 = local_40;
  goto LAB_0011baac;
LAB_0011b9cb:
  if ((plVar13 != (lyd_node *)0x0) && (local_50 != (char *)0x0)) {
    uVar19 = 0;
    do {
      if (local_e8->padding[2] == uVar19) goto LAB_0011baac;
      lVar30 = uVar19 * 8;
      uVar19 = uVar19 + 1;
    } while (*(long *)(local_50 + lVar30) == 0);
    pcVar29 = "Instance identifier is missing list key \"%s\".";
LAB_0011ba9a:
    ly_vlog(local_60,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar29);
    uVar31 = 0xffffffff;
    uVar15 = local_34;
  }
LAB_0011baac:
  free(local_50);
LAB_0011bab5:
  iVar8 = (int)uVar31;
  if (iVar8 < 1) {
LAB_0011bc2a:
    pcVar17 = local_80 + (uint)((int)local_68 - iVar8);
    ecode = LYE_INPRED;
    elem_type = LY_VLOG_LYD;
    plVar13 = local_98;
    plVar22 = local_58;
    goto LAB_0011bc49;
  }
  if (plVar13 == (lyd_node *)0x0) {
    unres_data_del((unres_data *)auStack_d8,uVar15);
  }
  else {
    uVar15 = uVar15 + 1;
  }
  name._4_4_ = name._4_4_ + 1;
  uVar32 = (uint)node_match.type;
  goto LAB_0011b476;
}

Assistant:

static int
resolve_instid(struct lyd_node *data, const char *path, int req_inst, struct lyd_node **ret)
{
    int i = 0, j, parsed, cur_idx;
    const struct lys_module *mod, *prev_mod = NULL;
    struct ly_ctx *ctx = data->schema->module->ctx;
    struct lyd_node *root, *node;
    const char *model = NULL, *name;
    char *str;
    int mod_len, name_len, has_predicate;
    struct unres_data node_match;

    memset(&node_match, 0, sizeof node_match);
    *ret = NULL;

    /* we need root to resolve absolute path */
    for (root = data; root->parent; root = root->parent);
    /* we're still parsing it and the pointer is not correct yet */
    if (root->prev) {
        for (; root->prev->next; root = root->prev);
    }

    /* search for the instance node */
    while (path[i]) {
        j = parse_instance_identifier(&path[i], &model, &mod_len, &name, &name_len, &has_predicate);
        if (j <= 0) {
            LOGVAL(ctx, LYE_INCHAR, LY_VLOG_LYD, data, path[i-j], &path[i-j]);
            goto error;
        }
        i += j;

        if (model) {
            str = strndup(model, mod_len);
            if (!str) {
                LOGMEM(ctx);
                goto error;
            }
            mod = ly_ctx_get_module(ctx, str, NULL, 1);
            if (ctx->data_clb) {
                if (!mod) {
                    mod = ctx->data_clb(ctx, str, NULL, 0, ctx->data_clb_data);
                } else if (!mod->implemented) {
                    mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
                }
            }
            free(str);

            if (!mod || !mod->implemented || mod->disabled) {
                break;
            }
        } else if (!prev_mod) {
            /* first iteration and we are missing module name */
            LOGVAL(ctx, LYE_INELEM_LEN, LY_VLOG_LYD, data, name_len, name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Instance-identifier is missing prefix in the first node.");
            goto error;
        } else {
            mod = prev_mod;
        }

        if (resolve_data(mod, name, name_len, root, &node_match)) {
            /* no instance exists */
            break;
        }

        if (has_predicate) {
            /* we have predicate, so the current results must be list or leaf-list */
            parsed = j = 0;
            /* index of the current node (for lists with position predicates) */
            cur_idx = 1;
            while (j < (signed)node_match.count) {
                node = node_match.node[j];
                parsed = resolve_instid_predicate(mod, &path[i], &node, cur_idx);
                if (parsed < 1) {
                    LOGVAL(ctx, LYE_INPRED, LY_VLOG_LYD, data, &path[i - parsed]);
                    goto error;
                }

                if (!node) {
                    /* current node does not satisfy the predicate */
                    unres_data_del(&node_match, j);
                } else {
                    ++j;
                }
                ++cur_idx;
            }

            i += parsed;
        } else if (node_match.count) {
            /* check that we are not addressing lists */
            for (j = 0; (unsigned)j < node_match.count; ++j) {
                if (node_match.node[j]->schema->nodetype == LYS_LIST) {
                    unres_data_del(&node_match, j--);
                }
            }
            if (!node_match.count) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYD, data, "Instance identifier is missing list keys.");
            }
        }

        prev_mod = mod;
    }

    if (!node_match.count) {
        /* no instance exists */
        if (req_inst > -1) {
            LOGVAL(ctx, LYE_NOREQINS, LY_VLOG_LYD, data, path);
            return EXIT_FAILURE;
        }
        LOGVRB("There is no instance of \"%s\", but it is not required.", path);
        return EXIT_SUCCESS;
    } else if (node_match.count > 1) {
        /* instance identifier must resolve to a single node */
        LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, data, path, "data tree");
        goto error;
    } else {
        /* we have required result, remember it and cleanup */
        *ret = node_match.node[0];
        free(node_match.node);
        return EXIT_SUCCESS;
    }

error:
    /* cleanup */
    free(node_match.node);
    return -1;
}